

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

void __thiscall imrt::Volume::print_deposition(Volume *this)

{
  bool bVar1;
  int iVar2;
  ostream *this_00;
  void *this_01;
  double *pdVar3;
  long in_RDI;
  int j;
  int i;
  Matrix *dm;
  int angle;
  pair<const_int,_maths::Matrix> d;
  iterator __end1;
  iterator __begin1;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  *__range1;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Collimator *in_stack_ffffffffffffff70;
  int local_5c;
  int local_58;
  int local_38;
  Matrix local_30;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 8;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
       ::begin((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
       ::end((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
              *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_maths::Matrix>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_int,_maths::Matrix>_> *)0x157ad7);
    std::pair<const_int,_maths::Matrix>::pair
              ((pair<const_int,_maths::Matrix> *)in_stack_ffffffffffffff70,
               (pair<const_int,_maths::Matrix> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    this_00 = std::operator<<((ostream *)&std::cout,"ANGLE: ");
    this_01 = (void *)std::ostream::operator<<(this_00,local_38);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x38); local_58 = local_58 + 1) {
      local_5c = 0;
      while( true ) {
        iVar2 = Collimator::getNangleBeamlets(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        if (iVar2 <= local_5c) break;
        pdVar3 = maths::Matrix::operator()(&local_30,local_58,local_5c);
        in_stack_ffffffffffffff70 = (Collimator *)std::ostream::operator<<(&std::cout,*pdVar3);
        std::operator<<((ostream *)in_stack_ffffffffffffff70,",");
        local_5c = local_5c + 1;
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    std::pair<const_int,_maths::Matrix>::~pair((pair<const_int,_maths::Matrix> *)0x157c2a);
    std::_Rb_tree_iterator<std::pair<const_int,_maths::Matrix>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_maths::Matrix>_> *)in_stack_ffffffffffffff70)
    ;
  }
  return;
}

Assistant:

void Volume::print_deposition() {
  for(auto d:D){
  //for (int a=0; a< nb_angles; a++) {
    int angle=d.first;
    Matrix* dm=&d.second;
    cout << "ANGLE: " << angle << endl;
    for (int i=0;i<nb_voxels;i++) {
      for (int j=0;j<collimator.getNangleBeamlets(angle);j++)
        cout << (*dm)(i,j) << ",";
      cout << endl;
    }
  }
}